

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktTessellationInvarianceTests.cpp
# Opt level: O3

TestStatus * __thiscall
vkt::tessellation::anon_unknown_0::InvariantOuterEdge::OuterEdgeIndexIndependenceTestInstance::
iterate(TestStatus *__return_storage_ptr__,OuterEdgeIndexIndependenceTestInstance *this)

{
  float *pfVar1;
  TessPrimitiveType TVar2;
  bool bVar3;
  deInt32 dVar4;
  ulong uVar5;
  _Rb_tree_node_base *p_Var6;
  char *pcVar7;
  size_t sVar8;
  ulong uVar9;
  int constantOuterLevelIndex;
  long lVar10;
  ulong uVar11;
  _Rb_tree_node_base *p_Var12;
  long lVar13;
  char *__s;
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> __last1;
  undefined1 __x [8];
  int numIndentationSpaces;
  ulong uVar14;
  int iVar15;
  long lVar16;
  pointer pOVar17;
  TestStatus *pTVar18;
  OuterEdgeDescription *edgeDesc;
  ulong uVar19;
  float fVar20;
  float fVar22;
  TestLog *pTVar21;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar23;
  vector<float,_std::allocator<float>_> patchTessLevels;
  Vec3Set currentEdgeVertices;
  DrawResult result;
  Vec3Set firstEdgeVertices;
  undefined1 local_320 [4];
  float afStack_31c [3];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_310;
  float local_2fc;
  string local_2f8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_2d8;
  string *local_2d0;
  TestStatus *local_2c8;
  vector<float,_std::allocator<float>_> local_2c0;
  float local_2a4;
  undefined1 local_2a0 [40];
  size_t local_278;
  long local_270;
  DrawResult local_268;
  set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
  local_240;
  undefined1 local_210 [32];
  undefined1 local_1f0 [32];
  long local_1d0;
  BaseTestInstance *local_1c8;
  undefined1 local_1c0 [8];
  float local_1b8 [2];
  _Rb_tree_node<tcu::Vector<float,_3>_> local_1b0 [2];
  ios_base local_148 [264];
  _Rb_tree_const_iterator<tcu::Vector<float,_3>_> local_40;
  _Base_ptr local_38;
  
  local_2d0 = (string *)&__return_storage_ptr__->m_description;
  local_2d8 = &(__return_storage_ptr__->m_description).field_2;
  lVar10 = 0;
  __last1._M_node = (_Base_ptr)this;
  local_2c8 = __return_storage_ptr__;
  local_1c8 = &this->super_BaseTestInstance;
  do {
    local_240._M_t._M_impl._0_1_ = 0;
    local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
         &local_240._M_t._M_impl.super__Rb_tree_header._M_header;
    local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
    local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
    local_240._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
    pOVar17 = (this->super_BaseTestInstance).m_edgeDescriptions.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
              ._M_impl.super__Vector_impl_data._M_start;
    local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
         local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    if (0 < (int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar17) >> 4)) {
      local_2fc = (float)(&tessellation::(anonymous_namespace)::InvariantOuterEdge::BaseTestInstance
                           ::m_singleOuterEdgeLevels)[lVar10];
      local_270 = 8;
      uVar19 = 0;
      local_1d0 = lVar10;
      do {
        constantOuterLevelIndex = (int)uVar19;
        generatePatchTessLevels
                  (&local_2c0,(this->super_BaseTestInstance).m_numPatchesToDraw,
                   constantOuterLevelIndex,local_2fc);
        BaseTestInstance::uploadVertexAttributes(&this->super_BaseTestInstance,&local_2c0);
        edgeDesc = pOVar17 + uVar19;
        logOuterTessellationLevel
                  (((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log,
                   local_2fc,edgeDesc);
        bVar3 = (this->super_BaseTestInstance).m_caseDef.usePointMode;
        uVar14 = (ulong)bVar3;
        BaseTestInstance::draw
                  (&local_268,&this->super_BaseTestInstance,
                   (deUint32)
                   ((ulong)((long)local_2c0.super__Vector_base<float,_std::allocator<float>_>.
                                  _M_impl.super__Vector_impl_data._M_finish -
                           (long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl
                                 .super__Vector_impl_data._M_start) >> 2),&local_2c0,
                   (this->super_BaseTestInstance).m_caseDef.winding,bVar3);
        lVar10 = local_270;
        numIndentationSpaces = (int)uVar14;
        if (local_268.success == false) {
          local_1c0 = (undefined1  [8])local_1b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c0,"Invalid set of vertices","");
          pTVar18 = local_2c8;
          local_2c8->m_code = QP_TEST_RESULT_FAIL;
          (local_2c8->m_description)._M_dataplus._M_p = (pointer)local_2d8;
          __x = local_1c0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2d0,local_1c0,
                     ((__aligned_membuf<tcu::Vector<float,_3>_> *)((long)local_1c0 + 0x20))->
                     _M_storage + CONCAT44(local_1b8[1],local_1b8[0]) + -0x20);
          if (local_1c0 != (undefined1  [8])local_1b0) {
            __x = (undefined1  [8])(local_1b0[0].super__Rb_tree_node_base._0_8_ + 1);
            operator_delete((void *)local_1c0,(ulong)__x);
          }
          goto LAB_007a424e;
        }
        local_2a0[0] = _S_red;
        local_2a0._8_4_ = _S_red;
        local_2a0._16_8_ = (_Base_ptr)0x0;
        local_2a0._24_8_ = local_2a0 + 8;
        local_278 = 0;
        local_2a0._32_8_ = local_2a0._24_8_;
        if (0 < local_268.numPrimitives) {
          lVar13 = 0;
          dVar4 = local_268.numPrimitives;
          iVar15 = local_268.numPrimitiveVertices;
          do {
            if (0 < iVar15) {
              lVar16 = 0;
              do {
                local_1b8[0] = local_268.primitives.
                               super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                               ._M_impl.super__Vector_impl_data._M_start[lVar13].tessCoord[lVar16].
                               m_data[2];
                pTVar21 = *(TestLog **)
                           local_268.primitives.
                           super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                           ._M_impl.super__Vector_impl_data._M_start[lVar13].tessCoord[lVar16].
                           m_data;
                local_1c0 = (undefined1  [8])pTVar21;
                uVar5 = (ulong)edgeDesc->numConstantCoordinateValueChoices;
                if (0 < (long)uVar5) {
                  fVar20 = *(float *)(local_1c0 + (long)edgeDesc->constantCoordinateIndex * 4);
                  if ((fVar20 != edgeDesc->constantCoordinateValueChoices[0]) ||
                     (NAN(fVar20) || NAN(edgeDesc->constantCoordinateValueChoices[0]))) {
                    uVar9 = 1;
                    do {
                      uVar11 = uVar9;
                      if (uVar5 == uVar11) break;
                      pfVar1 = (float *)((long)pOVar17->constantCoordinateValueChoices +
                                        uVar11 * 4 + lVar10 + -8);
                      uVar9 = uVar11 + 1;
                    } while ((fVar20 != *pfVar1) || (NAN(fVar20) || NAN(*pfVar1)));
                    if (uVar5 <= uVar11) goto LAB_007a3b77;
                  }
                  TVar2 = (this->super_BaseTestInstance).m_caseDef.primitiveType;
                  fVar20 = SUB84(pTVar21,0);
                  fVar22 = (float)((ulong)pTVar21 >> 0x20);
                  if (TVar2 == TESSPRIMITIVETYPE_QUADS) {
                    local_320 = (undefined1  [4])0xbf800000;
                    switch(uVar19 & 0xffffffff) {
                    case 0:
                    case 2:
                      pTVar21 = (TestLog *)(ulong)(uint)fVar22;
                    case 1:
                    case 3:
                      local_320 = SUB84(pTVar21,0);
                    }
                    afStack_31c[0] = 0.0;
                    afStack_31c[1] = 0.0;
                    local_2a4 = (float)local_320;
                    pVar23 = std::
                             _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                             ::_M_get_insert_unique_pos
                                       ((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                                         *)local_2a0,(key_type *)local_320);
                    p_Var12 = pVar23.second;
                    this = (OuterEdgeIndexIndependenceTestInstance *)local_1c8;
                    if (p_Var12 != (_Rb_tree_node_base *)0x0) {
                      bVar3 = true;
                      if (((_Rb_tree_node_base *)(local_2a0 + 8) != p_Var12 &&
                           pVar23.first == (_Rb_tree_node_base *)0x0) &&
                         ((float)p_Var12[1]._M_color <= local_2a4)) {
                        if (local_2a4 <= (float)p_Var12[1]._M_color) {
                          uVar5 = 0;
                          do {
                            uVar9 = uVar5;
                            uVar5 = uVar9;
                            if (uVar9 == 2) goto LAB_007a3b23;
                            if (afStack_31c[uVar9] < *(float *)(&p_Var12[1].field_0x4 + uVar9 * 4))
                            {
                              uVar5 = 1;
                              goto LAB_007a3b23;
                            }
                            uVar5 = uVar9 + 1;
                          } while (afStack_31c[uVar9] <=
                                   *(float *)(&p_Var12[1].field_0x4 + uVar9 * 4));
                          uVar5 = 0;
LAB_007a3b23:
                          bVar3 = (bool)(uVar9 < 2 & (byte)uVar5);
                        }
                        else {
                          bVar3 = false;
                        }
                      }
                      p_Var6 = (_Rb_tree_node_base *)operator_new(0x30);
                      *(float *)&p_Var6[1]._M_parent = afStack_31c[1];
                      *(ulong *)(p_Var6 + 1) = CONCAT44(afStack_31c[0],local_320);
                      std::_Rb_tree_insert_and_rebalance
                                (bVar3,p_Var6,p_Var12,(_Rb_tree_node_base *)(local_2a0 + 8));
                      local_278 = local_278 + 1;
                      this = (OuterEdgeIndexIndependenceTestInstance *)local_1c8;
                      iVar15 = local_268.numPrimitiveVertices;
                    }
                  }
                  else if (TVar2 == TESSPRIMITIVETYPE_TRIANGLES) {
                    local_320 = (undefined1  [4])fVar20;
                    afStack_31c[0] = fVar22;
                    afStack_31c[1] = local_1b8[0];
                    if (((constantOuterLevelIndex != 0) &&
                        (local_320 = (undefined1  [4])fVar22, afStack_31c[0] = fVar20,
                        constantOuterLevelIndex != 1)) &&
                       (local_320 = (undefined1  [4])local_1b8[0], afStack_31c[0] = fVar22,
                       afStack_31c[1] = fVar20, constantOuterLevelIndex != 2)) {
                      local_320 = (undefined1  [4])0xbf800000;
                      afStack_31c[0] = -1.0;
                      afStack_31c[1] = -1.0;
                    }
                    std::
                    set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    ::insert((set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                              *)local_2a0,(value_type *)local_320);
                  }
                }
LAB_007a3b77:
                lVar16 = lVar16 + 1;
                dVar4 = local_268.numPrimitives;
              } while (lVar16 < iVar15);
            }
            numIndentationSpaces = (int)uVar14;
            lVar13 = lVar13 + 1;
          } while (lVar13 < dVar4);
        }
        if (uVar19 != 0) {
          if (local_278 == local_240._M_t._M_impl.super__Rb_tree_header._M_node_count) {
            __last1._M_node = (_Base_ptr)(local_2a0 + 8);
            bVar3 = std::__equal<false>::
                    equal<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>,std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                              ((_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)local_2a0._24_8_,
                               __last1,(_Rb_tree_const_iterator<tcu::Vector<float,_3>_>)
                                       local_240._M_t._M_impl.super__Rb_tree_header._M_header.
                                       _M_left);
            if (bVar3) goto LAB_007a3bf4;
          }
          TVar2 = (this->super_BaseTestInstance).m_caseDef.primitiveType;
          if (TVar2 == TESSPRIMITIVETYPE_QUADS) {
            if (constantOuterLevelIndex == 1) {
              __s = "(x, 0)";
            }
            else {
              if (constantOuterLevelIndex != 2) {
                bVar3 = uVar19 == 3;
                pcVar7 = "(x, 0)";
                goto LAB_007a3e13;
              }
              __s = "(y, 0)";
            }
          }
          else if (TVar2 == TESSPRIMITIVETYPE_TRIANGLES) {
            if (uVar19 == 1) {
              __s = "(y, x, z)";
            }
            else {
              bVar3 = uVar19 == 2;
              pcVar7 = "(z, y, x)";
LAB_007a3e13:
              __s = (char *)0x0;
              if (bVar3) {
                __s = pcVar7;
              }
            }
          }
          else {
            __s = (char *)0x0;
          }
          pTVar21 = ((this->super_BaseTestInstance).super_TestInstance.m_context)->m_testCtx->m_log;
          local_1c0 = (undefined1  [8])pTVar21;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"Failure: the set of vertices on the ",0x24);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_320,edgeDesc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,(char *)CONCAT44(afStack_31c[0],local_320),
                     CONCAT44(afStack_31c[2],afStack_31c[1]));
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8," edge",5);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8," doesn\'t match the set of vertices on the ",0x2a);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    (&local_2f8,
                     (this->super_BaseTestInstance).m_edgeDescriptions.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8," edge",5);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(afStack_31c[0],local_320) != &local_310) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(afStack_31c[0],local_320),
                            local_310._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          std::ios_base::~ios_base(local_148);
          local_1c0 = (undefined1  [8])pTVar21;
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,"Note: set of vertices on ",0x19);
          pTVar18 = local_2c8;
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_320,edgeDesc);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,(char *)CONCAT44(afStack_31c[0],local_320),
                     CONCAT44(afStack_31c[2],afStack_31c[1]));
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8," edge, components swizzled like ",0x20);
          if (__s == (char *)0x0) {
            std::ios::clear((int)local_1b8 +
                            (int)*(undefined8 *)(CONCAT44(local_1b8[1],local_1b8[0]) + -0x18));
          }
          else {
            sVar8 = strlen(__s);
            std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,__s,sVar8);
          }
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8," to match component order on first edge:\n",0x29);
          local_1f0._0_8_ = local_2a0._24_8_;
          local_210._0_8_ = local_2a0 + 8;
          elemsStr<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                    (&local_2f8,(tessellation *)local_1f0,
                     (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)local_210,
                     (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)0x5,0,numIndentationSpaces);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,local_2f8._M_dataplus._M_p,local_2f8._M_string_length);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8,"\non ",4);
          tessellation::(anonymous_namespace)::OuterEdgeDescription::description_abi_cxx11_
                    ((string *)local_1f0,
                     (this->super_BaseTestInstance).m_edgeDescriptions.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,(char *)local_1f0._0_8_,local_1f0._8_8_);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1b8," edge:\n",7);
          local_38 = local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          local_40._M_node = &local_240._M_t._M_impl.super__Rb_tree_header._M_header;
          elemsStr<std::_Rb_tree_const_iterator<tcu::Vector<float,3>>>
                    ((string *)local_210,(tessellation *)&local_38,&local_40,
                     (_Rb_tree_const_iterator<tcu::Vector<float,_3>_> *)0x5,0,numIndentationSpaces);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1b8,(char *)local_210._0_8_,local_210._8_8_);
          tcu::MessageBuilder::operator<<
                    ((MessageBuilder *)local_1c0,(EndMessageToken *)&tcu::TestLog::EndMessage);
          if ((_Base_ptr)local_210._0_8_ != (_Base_ptr)(local_210 + 0x10)) {
            operator_delete((void *)local_210._0_8_,local_210._16_8_ + 1);
          }
          if ((_Base_ptr)local_1f0._0_8_ != (_Base_ptr)(local_1f0 + 0x10)) {
            operator_delete((void *)local_1f0._0_8_,local_1f0._16_8_ + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_2f8._M_dataplus._M_p != &local_2f8.field_2) {
            operator_delete(local_2f8._M_dataplus._M_p,local_2f8.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(afStack_31c[0],local_320) != &local_310) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(afStack_31c[0],local_320),
                            local_310._M_allocated_capacity + 1);
          }
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1b8);
          std::ios_base::~ios_base(local_148);
          local_1c0 = (undefined1  [8])local_1b0;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_1c0,"Invalid set of vertices","");
          pTVar18->m_code = QP_TEST_RESULT_FAIL;
          (pTVar18->m_description)._M_dataplus._M_p = (pointer)local_2d8;
          __x = local_1c0;
          std::__cxx11::string::_M_construct<char*>
                    (local_2d0,local_1c0,
                     ((__aligned_membuf<tcu::Vector<float,_3>_> *)((long)local_1c0 + 0x20))->
                     _M_storage + CONCAT44(local_1b8[1],local_1b8[0]) + -0x20);
          if (local_1c0 != (undefined1  [8])local_1b0) {
            __x = (undefined1  [8])(local_1b0[0].super__Rb_tree_node_base._0_8_ + 1);
            operator_delete((void *)local_1c0,(ulong)__x);
          }
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_2a0._16_8_,(_Link_type)__x);
LAB_007a424e:
          if (local_268.primitives.
              super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
              ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
            __x = (undefined1  [8])
                  ((long)local_268.primitives.
                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                         ._M_impl.super__Vector_impl_data._M_end_of_storage -
                  (long)local_268.primitives.
                        super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                        ._M_impl.super__Vector_impl_data._M_start);
            operator_delete(local_268.primitives.
                            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                            ._M_impl.super__Vector_impl_data._M_start,(ulong)__x);
          }
          if (local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
              super__Vector_impl_data._M_start != (pointer)0x0) {
            __x = (undefined1  [8])
                  ((long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                         super__Vector_impl_data._M_end_of_storage -
                  (long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                        super__Vector_impl_data._M_start);
            operator_delete(local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                            super__Vector_impl_data._M_start,(ulong)__x);
          }
          std::
          _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
          ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                      *)local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
                     (_Link_type)__x);
          return pTVar18;
        }
        __last1._M_node = (_Base_ptr)local_2a0;
        std::
        set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::operator=(&local_240,
                    (set<tcu::Vector<float,_3>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                     *)__last1._M_node);
LAB_007a3bf4:
        std::
        _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
        ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                    *)local_2a0._16_8_,(_Link_type)__last1._M_node);
        if (local_268.primitives.
            super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
            ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_268.primitives.
                      super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                      ._M_impl.super__Vector_impl_data._M_end_of_storage -
               (long)local_268.primitives.
                     super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                     ._M_impl.super__Vector_impl_data._M_start);
          operator_delete(local_268.primitives.
                          super__Vector_base<vkt::tessellation::(anonymous_namespace)::PerPrimitive,_std::allocator<vkt::tessellation::(anonymous_namespace)::PerPrimitive>_>
                          ._M_impl.super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        if (local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
            super__Vector_impl_data._M_start != (pointer)0x0) {
          __last1._M_node =
               (_Base_ptr)
               ((long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage -
               (long)local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                     super__Vector_impl_data._M_start);
          operator_delete(local_2c0.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data._M_start,(ulong)__last1._M_node);
        }
        uVar19 = uVar19 + 1;
        pOVar17 = (this->super_BaseTestInstance).m_edgeDescriptions.
                  super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        local_270 = local_270 + 0x10;
        lVar10 = local_1d0;
      } while ((long)uVar19 <
               (long)(int)((ulong)((long)(this->super_BaseTestInstance).m_edgeDescriptions.
                                         super__Vector_base<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription,_std::allocator<vkt::tessellation::(anonymous_namespace)::OuterEdgeDescription>_>
                                         ._M_impl.super__Vector_impl_data._M_finish - (long)pOVar17)
                          >> 4));
    }
    std::
    _Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
    ::_M_erase((_Rb_tree<tcu::Vector<float,_3>,_tcu::Vector<float,_3>,_std::_Identity<tcu::Vector<float,_3>_>,_vkt::tessellation::(anonymous_namespace)::VecLexLessThan<3>,_std::allocator<tcu::Vector<float,_3>_>_>
                *)local_240._M_t._M_impl.super__Rb_tree_header._M_header._M_parent,
               (_Link_type)__last1._M_node);
    lVar10 = lVar10 + 1;
    if (lVar10 == 0xc) {
      local_1c0 = (undefined1  [8])local_1b0;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_1c0,"OK","");
      pTVar18 = local_2c8;
      local_2c8->m_code = QP_TEST_RESULT_PASS;
      (local_2c8->m_description)._M_dataplus._M_p = (pointer)local_2d8;
      std::__cxx11::string::_M_construct<char*>
                (local_2d0,local_1c0,
                 (long)&((_Rb_tree_node_base *)local_1c0)->_M_color +
                 CONCAT44(local_1b8[1],local_1b8[0]));
      if (local_1c0 != (undefined1  [8])local_1b0) {
        operator_delete((void *)local_1c0,local_1b0[0].super__Rb_tree_node_base._0_8_ + 1);
      }
      return pTVar18;
    }
  } while( true );
}

Assistant:

tcu::TestStatus OuterEdgeIndexIndependenceTestInstance::iterate (void)
{
	for (int outerEdgeLevelCaseNdx = 0; outerEdgeLevelCaseNdx < DE_LENGTH_OF_ARRAY(m_singleOuterEdgeLevels); ++outerEdgeLevelCaseNdx)
	{
		Vec3Set firstEdgeVertices;

		for (int outerEdgeIndex = 0; outerEdgeIndex < static_cast<int>(m_edgeDescriptions.size()); ++outerEdgeIndex)
		{
			const OuterEdgeDescription& edgeDesc        = m_edgeDescriptions[outerEdgeIndex];
			const std::vector<float>    patchTessLevels = generatePatchTessLevels(m_numPatchesToDraw, outerEdgeIndex, m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx]);

			uploadVertexAttributes(patchTessLevels);
			logOuterTessellationLevel(m_context.getTestContext().getLog(), m_singleOuterEdgeLevels[outerEdgeLevelCaseNdx], edgeDesc);
			const DrawResult result = draw(static_cast<deUint32>(patchTessLevels.size()), patchTessLevels, m_caseDef.winding, m_caseDef.usePointMode);

			// Verify case result

			if (!result.success)
				return tcu::TestStatus::fail("Invalid set of vertices");

			Vec3Set currentEdgeVertices;

			// Get the vertices on the current outer edge.
			for (int primitiveNdx = 0; primitiveNdx < result.numPrimitives; ++primitiveNdx)
			for (int i = 0; i < result.numPrimitiveVertices; ++i)
			{
				const tcu::Vec3& coord = result.primitives[primitiveNdx].tessCoord[i].swizzle(0, 1, 2);
				if (edgeDesc.contains(coord))
				{
					// Swizzle components to match the order of the first edge.
					if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES)
						currentEdgeVertices.insert(outerEdgeIndex == 0 ? coord :
												   outerEdgeIndex == 1 ? coord.swizzle(1, 0, 2) :
												   outerEdgeIndex == 2 ? coord.swizzle(2, 1, 0) : tcu::Vec3(-1.0f));
					else if (m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS)
						currentEdgeVertices.insert(tcu::Vec3(outerEdgeIndex == 0 ? coord.y() :
															 outerEdgeIndex == 1 ? coord.x() :
															 outerEdgeIndex == 2 ? coord.y() :
															 outerEdgeIndex == 3 ? coord.x() : -1.0f,
															 0.0f, 0.0f));
					else
						DE_ASSERT(false);
				}
			}

			if (outerEdgeIndex == 0)
				firstEdgeVertices = currentEdgeVertices;
			else
			{
				// Compare vertices of this edge to those of the first edge.
				if (currentEdgeVertices != firstEdgeVertices)
				{
					const char* const swizzleDesc =
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_TRIANGLES ? (outerEdgeIndex == 1 ? "(y, x, z)" :
																				  outerEdgeIndex == 2 ? "(z, y, x)" : DE_NULL) :
						m_caseDef.primitiveType == TESSPRIMITIVETYPE_QUADS ? (outerEdgeIndex == 1 ? "(x, 0)" :
																			  outerEdgeIndex == 2 ? "(y, 0)" :
																			  outerEdgeIndex == 3 ? "(x, 0)" : DE_NULL)
						: DE_NULL;

					tcu::TestLog& log = m_context.getTestContext().getLog();
					log << tcu::TestLog::Message
						<< "Failure: the set of vertices on the " << edgeDesc.description() << " edge"
						<< " doesn't match the set of vertices on the " << m_edgeDescriptions[0].description() << " edge"
						<< tcu::TestLog::EndMessage;

					log << tcu::TestLog::Message
						<< "Note: set of vertices on " << edgeDesc.description() << " edge, components swizzled like " << swizzleDesc
						<< " to match component order on first edge:\n" << containerStr(currentEdgeVertices, 5)
						<< "\non " << m_edgeDescriptions[0].description() << " edge:\n" << containerStr(firstEdgeVertices, 5)
						<< tcu::TestLog::EndMessage;

					return tcu::TestStatus::fail("Invalid set of vertices");
				}
			}
		}
	}
	return tcu::TestStatus::pass("OK");
}